

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_rawset(lua_State *L)

{
  TValue *pTVar1;
  
  lj_lib_checktab(L,1);
  lj_lib_checkany(L,2);
  pTVar1 = lj_lib_checkany(L,3);
  L->top = pTVar1 + 1;
  lua_rawset(L,1);
  return 1;
}

Assistant:

LJLIB_CF(rawset)		LJLIB_REC(.)
{
  lj_lib_checktab(L, 1);
  lj_lib_checkany(L, 2);
  L->top = 1+lj_lib_checkany(L, 3);
  lua_rawset(L, 1);
  return 1;
}